

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanTypeConversions.cpp
# Opt level: O0

void Diligent::PrimitiveTopology_To_VkPrimitiveTopologyAndPatchCPCount
               (PRIMITIVE_TOPOLOGY PrimTopology,VkPrimitiveTopology *VkPrimTopology,
               uint32_t *PatchControlPoints)

{
  Char *pCVar1;
  char (*in_RCX) [113];
  undefined1 local_70 [8];
  string msg_1;
  undefined1 local_40 [8];
  string msg;
  uint32_t *PatchControlPoints_local;
  VkPrimitiveTopology *VkPrimTopology_local;
  PRIMITIVE_TOPOLOGY PrimTopology_local;
  
  *PatchControlPoints = 0;
  msg.field_2._8_8_ = PatchControlPoints;
  switch(PrimTopology) {
  case PRIMITIVE_TOPOLOGY_UNDEFINED:
    FormatString<char[29]>((string *)local_40,(char (*) [29])"Undefined primitive topology");
    pCVar1 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar1,"PrimitiveTopology_To_VkPrimitiveTopologyAndPatchCPCount",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanTypeConversions.cpp"
               ,0x429);
    std::__cxx11::string::~string((string *)local_40);
    *VkPrimTopology = VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST;
    break;
  case PRIMITIVE_TOPOLOGY_TRIANGLE_LIST:
    *VkPrimTopology = VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST;
    break;
  case PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP:
    *VkPrimTopology = VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP;
    break;
  case PRIMITIVE_TOPOLOGY_POINT_LIST:
    *VkPrimTopology = VK_PRIMITIVE_TOPOLOGY_POINT_LIST;
    break;
  case PRIMITIVE_TOPOLOGY_LINE_LIST:
    *VkPrimTopology = VK_PRIMITIVE_TOPOLOGY_LINE_LIST;
    break;
  case PRIMITIVE_TOPOLOGY_LINE_STRIP:
    *VkPrimTopology = VK_PRIMITIVE_TOPOLOGY_LINE_STRIP;
    break;
  case PRIMITIVE_TOPOLOGY_TRIANGLE_LIST_ADJ:
    *VkPrimTopology = VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST_WITH_ADJACENCY;
    break;
  case PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP_ADJ:
    *VkPrimTopology = VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP_WITH_ADJACENCY;
    break;
  case PRIMITIVE_TOPOLOGY_LINE_LIST_ADJ:
    *VkPrimTopology = VK_PRIMITIVE_TOPOLOGY_LINE_LIST_WITH_ADJACENCY;
    break;
  case PRIMITIVE_TOPOLOGY_LINE_STRIP_ADJ:
    *VkPrimTopology = VK_PRIMITIVE_TOPOLOGY_LINE_STRIP_WITH_ADJACENCY;
    break;
  default:
    if ((PrimTopology < PRIMITIVE_TOPOLOGY_1_CONTROL_POINT_PATCHLIST) ||
       (PRIMITIVE_TOPOLOGY_32_CONTROL_POINT_PATCHLIST < PrimTopology)) {
      FormatString<char[26],char[113]>
                ((string *)local_70,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])
                 "PrimTopology >= PRIMITIVE_TOPOLOGY_1_CONTROL_POINT_PATCHLIST && PrimTopology < PRIMITIVE_TOPOLOGY_NUM_TOPOLOGIES"
                 ,in_RCX);
      pCVar1 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar1,"PrimitiveTopology_To_VkPrimitiveTopologyAndPatchCPCount",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanTypeConversions.cpp"
                 ,0x452);
      std::__cxx11::string::~string((string *)local_70);
    }
    *VkPrimTopology = VK_PRIMITIVE_TOPOLOGY_PATCH_LIST;
    *(uint *)msg.field_2._8_8_ = PrimTopology - 9;
  }
  return;
}

Assistant:

void PrimitiveTopology_To_VkPrimitiveTopologyAndPatchCPCount(PRIMITIVE_TOPOLOGY   PrimTopology,
                                                             VkPrimitiveTopology& VkPrimTopology,
                                                             uint32_t&            PatchControlPoints)
{
    PatchControlPoints = 0;
    static_assert(PRIMITIVE_TOPOLOGY_NUM_TOPOLOGIES == 42, "Did you add a new primitive topology? Please handle it here.");
    switch (PrimTopology)
    {
        case PRIMITIVE_TOPOLOGY_UNDEFINED:
            UNEXPECTED("Undefined primitive topology");
            VkPrimTopology = VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST;
            return;

        case PRIMITIVE_TOPOLOGY_TRIANGLE_LIST:
            VkPrimTopology = VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST;
            return;

        case PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP:
            VkPrimTopology = VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP;
            return;

        case PRIMITIVE_TOPOLOGY_POINT_LIST:
            VkPrimTopology = VK_PRIMITIVE_TOPOLOGY_POINT_LIST;
            return;

        case PRIMITIVE_TOPOLOGY_LINE_LIST:
            VkPrimTopology = VK_PRIMITIVE_TOPOLOGY_LINE_LIST;
            return;

        case PRIMITIVE_TOPOLOGY_LINE_STRIP:
            VkPrimTopology = VK_PRIMITIVE_TOPOLOGY_LINE_STRIP;
            return;

        case PRIMITIVE_TOPOLOGY_TRIANGLE_LIST_ADJ:
            VkPrimTopology = VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST_WITH_ADJACENCY;
            return;

        case PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP_ADJ:
            VkPrimTopology = VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP_WITH_ADJACENCY;
            return;

        case PRIMITIVE_TOPOLOGY_LINE_LIST_ADJ:
            VkPrimTopology = VK_PRIMITIVE_TOPOLOGY_LINE_LIST_WITH_ADJACENCY;
            return;

        case PRIMITIVE_TOPOLOGY_LINE_STRIP_ADJ:
            VkPrimTopology = VK_PRIMITIVE_TOPOLOGY_LINE_STRIP_WITH_ADJACENCY;
            return;

        default:
            VERIFY_EXPR(PrimTopology >= PRIMITIVE_TOPOLOGY_1_CONTROL_POINT_PATCHLIST && PrimTopology < PRIMITIVE_TOPOLOGY_NUM_TOPOLOGIES);
            VkPrimTopology     = VK_PRIMITIVE_TOPOLOGY_PATCH_LIST;
            PatchControlPoints = static_cast<uint32_t>(PrimTopology) - static_cast<uint32_t>(PRIMITIVE_TOPOLOGY_1_CONTROL_POINT_PATCHLIST) + 1;
            return;
    }
}